

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O2

void __thiscall
StatisticsWriter::writeHistogram<double>
          (StatisticsWriter *this,ostream *stream,string *title,DynamicHistogram<double> *histogram)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  reference pvVar4;
  ostream *poVar5;
  int iVar6;
  size_type sVar7;
  pointer plVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  vector<long,_std::allocator<long>_> width;
  string header;
  vector<double,_std::allocator<double>_> pdf;
  vector<double,_std::allocator<double>_> freq;
  vector<double,_std::allocator<double>_> cdf;
  string local_150;
  string indent;
  string footer;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  freq.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  freq.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  freq.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pdf.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  pdf.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  pdf.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cdf.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  cdf.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  cdf.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  header._M_dataplus._M_p = (pointer)0x0;
  std::vector<long,_std::allocator<long>_>::vector
            (&width,6,(value_type_conflict3 *)&header,(allocator_type *)&footer);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Bin Min",(allocator<char> *)&header);
  StringParser::updateWidthString
            (&local_50,
             width.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Bin Max",(allocator<char> *)&header);
  StringParser::updateWidthString
            (&local_70,
             width.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start + 1);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"Center",(allocator<char> *)&header);
  StringParser::updateWidthString
            (&local_90,
             width.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start + 2);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"Frequency",(allocator<char> *)&header);
  StringParser::updateWidthString
            (&local_b0,
             width.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start + 3);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"PDF",(allocator<char> *)&header);
  StringParser::updateWidthString
            (&local_d0,
             width.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start + 4);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"CDF",(allocator<char> *)&header);
  StringParser::updateWidthString
            (&local_f0,
             width.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start + 5);
  std::__cxx11::string::~string((string *)&local_f0);
  uVar3 = DynamicHistogram<double>::count(histogram);
  DynamicHistogram<double>::frequencies
            ((vector<double,_std::allocator<double>_> *)&header,histogram);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&freq,&header);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&header);
  DynamicHistogram<double>::pdf((vector<double,_std::allocator<double>_> *)&header,histogram);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&pdf,&header);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&header);
  DynamicHistogram<double>::cdf((vector<double,_std::allocator<double>_> *)&header,histogram);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&cdf,&header);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&header);
  for (sVar7 = 0; uVar3 != sVar7; sVar7 = sVar7 + 1) {
    StringParser::updateWidthNumber<long>
              (sVar7,width.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start);
    iVar6 = (int)sVar7;
    dVar10 = DynamicHistogram<double>::bin(histogram,iVar6);
    dVar11 = DynamicHistogram<double>::width(histogram,iVar6);
    StringParser::updateWidthNumber<double>
              (dVar10 + dVar11 * -0.5,
               width.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
               ._M_start + 1);
    dVar10 = DynamicHistogram<double>::bin(histogram,iVar6);
    dVar11 = DynamicHistogram<double>::width(histogram,iVar6);
    StringParser::updateWidthNumber<double>
              (dVar10 + dVar11 * 0.5,
               width.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
               ._M_start + 2);
    pvVar4 = std::vector<double,_std::allocator<double>_>::at(&freq,sVar7);
    StringParser::updateWidthNumber<long_long>
              ((long)*pvVar4,
               width.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
               ._M_start + 3);
    pvVar4 = std::vector<double,_std::allocator<double>_>::at(&pdf,sVar7);
    StringParser::updateWidthNumber<double>
              (*pvVar4,width.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start + 4);
    pvVar4 = std::vector<double,_std::allocator<double>_>::at(&cdf,sVar7);
    StringParser::updateWidthNumber<double>
              (*pvVar4,width.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start + 5);
  }
  uVar9 = 0;
  for (plVar8 = width.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
      plVar8 != width.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish; plVar8 = plVar8 + 1) {
    lVar1 = *plVar8;
    *plVar8 = lVar1 + 3;
    uVar9 = uVar9 + lVar1 + 3;
  }
  header._M_dataplus._M_p = (pointer)&header.field_2;
  std::__cxx11::string::_M_construct((string *)&header,uVar9,'=');
  footer._M_dataplus._M_p = (pointer)&footer.field_2;
  std::__cxx11::string::_M_construct((string *)&footer,uVar9,'-');
  poVar5 = std::operator<<((ostream *)stream,(string *)this);
  poVar5 = std::operator<<(poVar5,(string *)&header);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)stream,(string *)this);
  poVar5 = std::operator<<(poVar5,0x20);
  *(long *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = (long)(int)((long)uVar9 / 2);
  poVar5 = std::operator<<(poVar5,"Histogram of ");
  poVar5 = std::operator<<(poVar5,(string *)title);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)stream,(string *)this);
  poVar5 = std::operator<<(poVar5,(string *)&header);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::operator<<((ostream *)stream,(string *)this);
  lVar1 = *(long *)stream;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xffffff4f | 0x80;
  *(long *)(stream + *(long *)(lVar1 + -0x18) + 0x10) =
       (long)(int)*width.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
  poVar5 = std::operator<<((ostream *)stream,"Bin");
  lVar1 = *(long *)poVar5;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
  *(long *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) =
       (long)(int)width.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start[1];
  poVar5 = std::operator<<(poVar5,"Min");
  lVar1 = *(long *)poVar5;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
  *(long *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) =
       (long)(int)width.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start[2];
  poVar5 = std::operator<<(poVar5,"Max");
  lVar1 = *(long *)poVar5;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
  *(long *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) =
       (long)(int)width.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start[3];
  poVar5 = std::operator<<(poVar5,"Frequency");
  lVar1 = *(long *)poVar5;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
  *(long *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) =
       (long)(int)width.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start[4];
  poVar5 = std::operator<<(poVar5,"PDF");
  lVar1 = *(long *)poVar5;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffff4f | 0x80;
  *(long *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) =
       (long)(int)width.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start[5];
  poVar5 = std::operator<<(poVar5,"CDF");
  std::endl<char,std::char_traits<char>>(poVar5);
  indent._M_dataplus._M_p = (pointer)&indent.field_2;
  std::__cxx11::string::_M_construct((string *)&indent,(this->_comment)._M_string_length,' ');
  for (sVar7 = 0; uVar3 != sVar7; sVar7 = sVar7 + 1) {
    std::operator<<((ostream *)stream,(string *)&indent);
    lVar1 = *(long *)stream;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xffffff4f | 0x80;
    *(long *)(stream + *(long *)(lVar1 + -0x18) + 0x10) =
         (long)(int)*width.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start;
    StringParser::parseNumber<long>(&local_150,sVar7,false);
    std::operator<<((ostream *)stream,(string *)&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    lVar1 = *(long *)stream;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xffffff4f | 0x80;
    *(long *)(stream + *(long *)(lVar1 + -0x18) + 0x10) =
         (long)(int)width.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start[1];
    iVar6 = (int)sVar7;
    dVar10 = DynamicHistogram<double>::bin(histogram,iVar6);
    dVar11 = DynamicHistogram<double>::width(histogram,iVar6);
    StringParser::parseNumber<double>(&local_150,dVar10 + dVar11 * -0.5,false);
    std::operator<<((ostream *)stream,(string *)&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    lVar1 = *(long *)stream;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xffffff4f | 0x80;
    *(long *)(stream + *(long *)(lVar1 + -0x18) + 0x10) =
         (long)(int)width.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start[2];
    dVar10 = DynamicHistogram<double>::bin(histogram,iVar6);
    dVar11 = DynamicHistogram<double>::width(histogram,iVar6);
    StringParser::parseNumber<double>(&local_150,dVar10 + dVar11 * 0.5,false);
    std::operator<<((ostream *)stream,(string *)&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    lVar1 = *(long *)stream;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xffffff4f | 0x80;
    *(long *)(stream + *(long *)(lVar1 + -0x18) + 0x10) =
         (long)(int)width.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start[3];
    pvVar4 = std::vector<double,_std::allocator<double>_>::at(&freq,sVar7);
    StringParser::parseNumber<long_long>(&local_150,(long)*pvVar4,false);
    std::operator<<((ostream *)stream,(string *)&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    lVar1 = *(long *)stream;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xffffff4f | 0x80;
    *(long *)(stream + *(long *)(lVar1 + -0x18) + 0x10) =
         (long)(int)width.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start[4];
    pvVar4 = std::vector<double,_std::allocator<double>_>::at(&pdf,sVar7);
    StringParser::parseNumber<double>(&local_150,*pvVar4,false);
    std::operator<<((ostream *)stream,(string *)&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    lVar1 = *(long *)stream;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xffffff4f | 0x80;
    *(long *)(stream + *(long *)(lVar1 + -0x18) + 0x10) =
         (long)(int)width.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start[5];
    pvVar4 = std::vector<double,_std::allocator<double>_>::at(&cdf,sVar7);
    StringParser::parseNumber<double>(&local_150,*pvVar4,false);
    std::operator<<((ostream *)stream,(string *)&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::endl<char,std::char_traits<char>>((ostream *)stream);
  }
  std::__cxx11::string::~string((string *)&indent);
  std::__cxx11::string::~string((string *)&footer);
  std::__cxx11::string::~string((string *)&header);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&width.super__Vector_base<long,_std::allocator<long>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&cdf.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&pdf.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&freq.super__Vector_base<double,_std::allocator<double>_>);
  std::endl<char,std::char_traits<char>>((ostream *)stream);
  return;
}

Assistant:

void
    writeHistogram(std::ostream & stream,
                   std::string const & title,
                   DynamicHistogram<T> & histogram)
    {

        try
        {

            unsigned int nBins = 0;
            std::vector<double> freq;
            std::vector<double> pdf;
            std::vector<double> cdf;

            // Compute column widths
            std::vector<long> width(6,0);
            StringParser::updateWidthString("Bin Min", width[0]);
            StringParser::updateWidthString("Bin Max", width[1]);
            StringParser::updateWidthString("Center", width[2]);
            StringParser::updateWidthString("Frequency", width[3]);
            StringParser::updateWidthString("PDF", width[4]);
            StringParser::updateWidthString("CDF", width[5]);

            nBins = histogram.count();
            freq = histogram.frequencies();
            pdf = histogram.pdf();
            cdf = histogram.cdf();
            for (unsigned int i = 0; i < nBins; i++)
            {
                StringParser::updateWidthNumber<long>(i, width[0]);
                StringParser::updateWidthNumber<double>(histogram.bin(i)-histogram.width(i)/2, width[1]);
                StringParser::updateWidthNumber<double>(histogram.bin(i)+histogram.width(i)/2, width[2]);
                StringParser::updateWidthNumber<long long>((long long)freq.at(i), width[3]);
                StringParser::updateWidthNumber<double>(pdf.at(i), width[4]);
                StringParser::updateWidthNumber<double>(cdf.at(i), width[5]);
            }

            long totalWidth = 0;
            for (std::vector<long>::iterator it = width.begin(); it != width.end(); ++it)
            {
                (*it) += 3;
                totalWidth += *it;
            }

            // Print data headers
            std::string header(totalWidth,'=');
            std::string footer(totalWidth,'-');
            stream << this->_comment << header << std::endl;
            stream << this->_comment << std::setfill (' ') << std::setw (totalWidth/2) << "Histogram of " << title << std::endl;
            stream << this->_comment << header << std::endl;
            stream << this->_comment;
            stream << std::right << std::setw(width[0]) << "Bin"
                   << std::right << std::setw(width[1]) << "Min"
                   << std::right << std::setw(width[2]) << "Max"
                   << std::right << std::setw(width[3]) << "Frequency"
                   << std::right << std::setw(width[4]) << "PDF"
                   << std::right << std::setw(width[5]) << "CDF"
                   << std::endl;

            // Print data
            std::string indent(this->_comment.size(), ' ');
            for (unsigned int i = 0; i < nBins; i++)
            {
                stream << indent;
                stream << std::right << std::setw(width[0]) << StringParser::parseNumber<long>(i);
                stream << std::right << std::setw(width[1]) << StringParser::parseNumber<double>(histogram.bin(i)-histogram.width(i)/2);
                stream << std::right << std::setw(width[2]) << StringParser::parseNumber<double>(histogram.bin(i)+histogram.width(i)/2);
                stream << std::right << std::setw(width[3]) << StringParser::parseNumber<long long>((long long)freq.at(i));
                stream << std::right << std::setw(width[4]) << StringParser::parseNumber<double>(pdf.at(i));
                stream << std::right << std::setw(width[5]) << StringParser::parseNumber<double>(cdf.at(i));
                stream << std::endl;
            }

        }
        catch (...)
        {
            stream << "No valid data" << std::endl;
        }
        stream << std::endl;

        return;
    }